

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::
     RenderLineSegments<ImPlot::GetterXsYs<unsigned_int>,ImPlot::GetterXsYRef<unsigned_int>,ImPlot::TransformerLogLin>
               (GetterXsYs<unsigned_int> *getter1,GetterXsYRef<unsigned_int> *getter2,
               TransformerLogLin *transformer,ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  ImVec2 IVar2;
  double dVar3;
  int iVar4;
  uint uVar5;
  ImPlotPlot *pIVar6;
  float fVar7;
  ImPlotContext *pIVar8;
  ImPlotContext *pIVar9;
  ImPlotContext *pIVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  double dVar14;
  double dVar15;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_60;
  undefined1 local_58 [8];
  GetterXsYRef<unsigned_int> *local_50;
  TransformerLogLin *local_48;
  int local_40;
  ImU32 local_3c;
  float local_38;
  
  pIVar8 = GImPlot;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_40 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_40 = getter1->Count;
    }
    local_58 = (undefined1  [8])getter1;
    local_50 = getter2;
    local_48 = transformer;
    local_3c = col;
    local_38 = line_weight;
    RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_int>,ImPlot::GetterXsYRef<unsigned_int>,ImPlot::TransformerLogLin>>
              ((LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYRef<unsigned_int>,_ImPlot::TransformerLogLin>
                *)local_58,DrawList,&GImPlot->CurrentPlot->PlotRect);
  }
  else {
    iVar12 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      iVar12 = getter1->Count;
    }
    if (0 < iVar12) {
      iVar13 = 0;
      do {
        pIVar9 = GImPlot;
        iVar4 = getter1->Count;
        lVar11 = (long)(((getter1->Offset + iVar13) % iVar4 + iVar4) % iVar4) *
                 (long)getter1->Stride;
        uVar5 = *(uint *)((long)getter1->Ys + lVar11);
        dVar14 = log10((double)*(uint *)((long)getter1->Xs + lVar11) /
                       (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar10 = GImPlot;
        pIVar6 = pIVar9->CurrentPlot;
        dVar3 = (pIVar6->XAxis).Range.Min;
        iVar4 = transformer->YAxis;
        IVar2 = pIVar9->PixelRange[iVar4].Min;
        local_58._0_4_ =
             (undefined4)
             (pIVar9->Mx *
              (((double)(float)(dVar14 / pIVar9->LogDenX) * ((pIVar6->XAxis).Range.Max - dVar3) +
               dVar3) - dVar3) + (double)IVar2.x);
        local_58._4_4_ =
             (undefined4)
             (pIVar9->My[iVar4] * ((double)uVar5 - pIVar6->YAxis[iVar4].Range.Min) + (double)IVar2.y
             );
        iVar4 = getter2->Count;
        dVar3 = getter2->YRef;
        dVar15 = log10((double)*(uint *)((long)getter2->Xs +
                                        (long)(((getter2->Offset + iVar13) % iVar4 + iVar4) % iVar4)
                                        * (long)getter2->Stride) /
                       (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar6 = pIVar10->CurrentPlot;
        dVar14 = (pIVar6->XAxis).Range.Min;
        iVar4 = transformer->YAxis;
        IVar2 = pIVar10->PixelRange[iVar4].Min;
        local_60.x = (float)(pIVar10->Mx *
                             (((double)(float)(dVar15 / pIVar10->LogDenX) *
                               ((pIVar6->XAxis).Range.Max - dVar14) + dVar14) - dVar14) +
                            (double)IVar2.x);
        local_60.y = (float)(pIVar10->My[iVar4] * (dVar3 - pIVar6->YAxis[iVar4].Range.Min) +
                            (double)IVar2.y);
        pIVar6 = pIVar8->CurrentPlot;
        fVar7 = (float)local_58._4_4_;
        if (local_60.y <= (float)local_58._4_4_) {
          fVar7 = local_60.y;
        }
        if ((fVar7 < (pIVar6->PlotRect).Max.y) &&
           (fVar7 = (float)(~-(uint)(local_60.y <= (float)local_58._4_4_) & (uint)local_60.y |
                           local_58._4_4_ & -(uint)(local_60.y <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar6->PlotRect).Min.y, *pfVar1 <= fVar7 && fVar7 != *pfVar1)) {
          fVar7 = (float)local_58._0_4_;
          if (local_60.x <= (float)local_58._0_4_) {
            fVar7 = local_60.x;
          }
          if ((fVar7 < (pIVar6->PlotRect).Max.x) &&
             (fVar7 = (float)(-(uint)(local_60.x <= (float)local_58._0_4_) & local_58._0_4_ |
                             ~-(uint)(local_60.x <= (float)local_58._0_4_) & (uint)local_60.x),
             (pIVar6->PlotRect).Min.x <= fVar7 && fVar7 != (pIVar6->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_60,col,line_weight);
          }
        }
        iVar13 = iVar13 + 1;
      } while (iVar12 != iVar13);
    }
  }
  return;
}

Assistant:

inline void RenderLineSegments(const Getter1& getter1, const Getter2& getter2, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        int I = ImMin(getter1.Count, getter2.Count);
        for (int i = 0; i < I; ++i) {
            ImVec2 p1 = transformer(getter1(i));
            ImVec2 p2 = transformer(getter2(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
        }
    }
    else {
        RenderPrimitives(LineSegmentsRenderer<Getter1,Getter2,Transformer>(getter1, getter2, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}